

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::ComputeHomeRelativeOutputPath(cmLocalUnixMakefileGenerator3 *this)

{
  bool bVar1;
  string *psVar2;
  string *remote_path;
  ulong uVar3;
  string local_30;
  cmLocalUnixMakefileGenerator3 *local_10;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_10 = this;
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  remote_path = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&local_30,(cmLocalGenerator *)this,psVar2,remote_path);
  std::__cxx11::string::operator=((string *)&this->HomeRelativeOutputPath,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = std::operator==(&this->HomeRelativeOutputPath,".");
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&this->HomeRelativeOutputPath,"/");
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ComputeHomeRelativeOutputPath()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->MaybeConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }
  if (!this->HomeRelativeOutputPath.empty()) {
    this->HomeRelativeOutputPath += "/";
  }
}